

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O2

ostream * OpenMD::operator<<(ostream *o,Vector<double,_3U> *v)

{
  uint i;
  long lVar1;
  
  std::operator<<(o,"[ ");
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    std::ostream::_M_insert<double>(v->data_[lVar1]);
    if (lVar1 != 2) {
      std::operator<<(o,", ");
    }
  }
  std::operator<<(o," ]");
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, const Vector<Real, Dim>& v) {
    o << "[ ";

    for (unsigned int i = 0; i < Dim; i++) {
      o << v[i];

      if (i != Dim - 1) { o << ", "; }
    }

    o << " ]";
    return o;
  }